

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::OutputFile::setFrameBuffer(OutputFile *this,FrameBuffer *frameBuffer)

{
  _Base_ptr name;
  undefined8 *puVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer pOVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  int iVar8;
  bool bVar9;
  undefined7 uVar10;
  PixelType PVar11;
  undefined4 uVar12;
  pointer pOVar13;
  OutSliceInfo_conflict *__cur;
  ChannelList *this_00;
  const_iterator cVar14;
  ConstIterator CVar15;
  ConstIterator CVar16;
  const_iterator cVar17;
  pointer pOVar18;
  long lVar19;
  pointer pOVar20;
  ostream *poVar21;
  char *pcVar22;
  ArgExc *pAVar23;
  size_t __n;
  ulong __n_00;
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  size_t sStack_1a8;
  size_t sStack_1a0;
  undefined8 local_198;
  bool local_190;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = Header::channels(&this->_data->header);
  cVar14._M_node = (_Base_ptr)ChannelList::begin(this_00);
  do {
    CVar15 = ChannelList::end(this_00);
    if ((const_iterator)cVar14._M_node == CVar15._i._M_node) {
      slices.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      slices.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      slices.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar14._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar15 = ChannelList::end(this_00);
        if ((const_iterator)cVar14._M_node == CVar15._i._M_node) break;
        CVar16 = FrameBuffer::find(frameBuffer,(char *)(cVar14._M_node + 1));
        cVar17._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
        if (CVar16._i._M_node == (const_iterator)cVar17._M_node) {
          __iex_throw_s = cVar14._M_node[9]._M_color;
          sStack_1a0 = 0;
          sStack_1a8 = 0;
          local_198 = *(undefined8 *)&cVar14._M_node[9].field_0x4;
          local_190 = true;
          std::
          vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back(&slices,(value_type *)&_iex_throw_s);
        }
        else {
          __iex_throw_s = *(_Rb_tree_color *)((long)CVar16._i._M_node + 0x120);
          sStack_1a8 = *(size_t *)((long)CVar16._i._M_node + 0x130);
          sStack_1a0 = *(size_t *)((long)CVar16._i._M_node + 0x138);
          local_198 = *(undefined8 *)((long)CVar16._i._M_node + 0x140);
          local_190 = false;
          std::
          vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back(&slices,(value_type *)&_iex_throw_s);
        }
        cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&this->_data->frameBuffer,
                  (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)frameBuffer);
      pOVar13 = slices.
                super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pOVar3 = slices.
               super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 = this->_data;
      __n_00 = (long)slices.
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)slices.
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pOVar18 = (pDVar2->slices).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar2->slices).
                        super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar18) < __n_00
         ) {
        pOVar18 = std::
                  _Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                                 *)((long)__n_00 / 0x30),(size_t)frameBuffer);
        for (lVar19 = 0; pOVar20 = (pointer)((long)&pOVar3->type + lVar19), pOVar20 != pOVar13;
            lVar19 = lVar19 + 0x30) {
          puVar1 = (undefined8 *)((long)&pOVar18->type + lVar19);
          uVar4 = *(undefined8 *)pOVar20;
          pcVar22 = pOVar20->base;
          sVar5 = pOVar20->xStride;
          sVar6 = pOVar20->yStride;
          uVar7 = *(undefined8 *)&pOVar20->zero;
          puVar1[4] = *(undefined8 *)&pOVar20->xSampling;
          puVar1[5] = uVar7;
          puVar1[2] = sVar5;
          puVar1[3] = sVar6;
          *puVar1 = uVar4;
          puVar1[1] = pcVar22;
        }
        pOVar3 = (pDVar2->slices).
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = (long)(pDVar2->slices).
                       super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar3;
        std::
        _Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
        ::_M_deallocate((_Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                         *)pOVar3,(pointer)(lVar19 / 0x30),lVar19 % 0x30);
        (pDVar2->slices).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pOVar18;
        (pDVar2->slices).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pOVar18 + __n_00);
      }
      else {
        pOVar20 = (pDVar2->slices).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pOVar20 - (long)pOVar18;
        if (__n < __n_00) {
          if (pOVar20 != pOVar18) {
            memmove(pOVar18,slices.
                            super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
            pOVar20 = (pDVar2->slices).
                      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __n = (long)pOVar20 -
                  (long)(pDVar2->slices).
                        super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          }
          for (pOVar18 = (pointer)((long)&pOVar3->type + __n); pOVar18 != pOVar13;
              pOVar18 = pOVar18 + 1) {
            PVar11 = pOVar18->type;
            uVar12 = *(undefined4 *)&pOVar18->field_0x4;
            pcVar22 = pOVar18->base;
            sVar5 = pOVar18->xStride;
            sVar6 = pOVar18->yStride;
            iVar8 = pOVar18->ySampling;
            bVar9 = pOVar18->zero;
            uVar10 = *(undefined7 *)&pOVar18->field_0x29;
            pOVar20->xSampling = pOVar18->xSampling;
            pOVar20->ySampling = iVar8;
            pOVar20->zero = bVar9;
            *(undefined7 *)&pOVar20->field_0x29 = uVar10;
            pOVar20->xStride = sVar5;
            pOVar20->yStride = sVar6;
            pOVar20->type = PVar11;
            *(undefined4 *)&pOVar20->field_0x4 = uVar12;
            pOVar20->base = pcVar22;
            pOVar20 = pOVar20 + 1;
          }
        }
        else if (slices.
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 slices.
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pOVar18,slices.
                          super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(__n_00 + (long)(pDVar2->slices).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
      ::~vector(&slices);
      pthread_mutex_unlock(__mutex);
      return;
    }
    name = cVar14._M_node + 1;
    CVar16 = FrameBuffer::find(frameBuffer,(char *)name);
    cVar17._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
    if (CVar16._i._M_node != (const_iterator)cVar17._M_node) {
      if (cVar14._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar16._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar21 = std::operator<<((ostream *)&sStack_1a8,"Pixel type of \"");
        poVar21 = std::operator<<(poVar21,(char *)name);
        poVar21 = std::operator<<(poVar21,"\" channel of output file \"");
        pcVar22 = fileName(this);
        poVar21 = std::operator<<(poVar21,pcVar22);
        std::operator<<(poVar21,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar23,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar23,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if ((*(int *)&cVar14._M_node[9].field_0x4 != *(int *)((long)CVar16._i._M_node + 0x140)) ||
         (*(int *)&cVar14._M_node[9]._M_parent != *(int *)((long)CVar16._i._M_node + 0x144))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar21 = std::operator<<((ostream *)&sStack_1a8,"X and/or y subsampling factors of \"");
        poVar21 = std::operator<<(poVar21,(char *)name);
        poVar21 = std::operator<<(poVar21,"\" channel of output file \"");
        pcVar22 = fileName(this);
        poVar21 = std::operator<<(poVar21,pcVar22);
        std::operator<<(poVar21,
                        "\" are not compatible with the frame buffer\'s subsampling factors.");
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar23,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar23,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
  } while( true );
}

Assistant:

void
OutputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");
        }

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of output file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
        }
    }

    //
    // Initialize slice table for writePixels().
    //

    vector<OutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (OutSliceInfo (
                i.channel ().type,
                0, // base
                0, // xStride,
                0, // yStride,
                i.channel ().xSampling,
                i.channel ().ySampling,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (OutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().xStride,
                j.slice ().yStride,
                j.slice ().xSampling,
                j.slice ().ySampling,
                false)); // zero
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices      = slices;
}